

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.h
# Opt level: O0

void __thiscall
google::protobuf::strings::Hex::Hex<unsigned_long>(Hex *this,unsigned_long v,PadSpec s)

{
  PadSpec s_local;
  unsigned_long v_local;
  Hex *this_local;
  
  this->spec = s;
  this->value = v;
  return;
}

Assistant:

explicit Hex(Int v, PadSpec s = NO_PAD)
      : spec(s) {
    // Prevent sign-extension by casting integers to
    // their unsigned counterparts.
#ifdef LANG_CXX11
    static_assert(
        sizeof(v) == 1 || sizeof(v) == 2 || sizeof(v) == 4 || sizeof(v) == 8,
        "Unknown integer type");
#endif
    value = sizeof(v) == 1 ? static_cast<uint8>(v)
          : sizeof(v) == 2 ? static_cast<uint16>(v)
          : sizeof(v) == 4 ? static_cast<uint32>(v)
          : static_cast<uint64>(v);
  }